

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis.cpp
# Opt level: O2

SENode * __thiscall
spvtools::opt::ScalarEvolutionAnalysis::AnalyzeMultiplyOp
          (ScalarEvolutionAnalysis *this,Instruction *multiply)

{
  uint32_t uVar1;
  DefUseManager *this_00;
  Instruction *pIVar2;
  SENode *pSVar3;
  SENode *operand_2;
  
  if (multiply->opcode_ == OpIMul) {
    this_00 = IRContext::get_def_use_mgr(this->context_);
    uVar1 = Instruction::GetSingleWordInOperand(multiply,0);
    pIVar2 = analysis::DefUseManager::GetDef(this_00,uVar1);
    pSVar3 = AnalyzeInstruction(this,pIVar2);
    uVar1 = Instruction::GetSingleWordInOperand(multiply,1);
    pIVar2 = analysis::DefUseManager::GetDef(this_00,uVar1);
    operand_2 = AnalyzeInstruction(this,pIVar2);
    pSVar3 = CreateMultiplyNode(this,pSVar3,operand_2);
    return pSVar3;
  }
  __assert_fail("multiply->opcode() == spv::Op::OpIMul && \"Multiply node did not come from a multiply instruction\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/scalar_analysis.cpp"
                ,100,
                "SENode *spvtools::opt::ScalarEvolutionAnalysis::AnalyzeMultiplyOp(const Instruction *)"
               );
}

Assistant:

SENode* ScalarEvolutionAnalysis::AnalyzeMultiplyOp(
    const Instruction* multiply) {
  assert(multiply->opcode() == spv::Op::OpIMul &&
         "Multiply node did not come from a multiply instruction");
  analysis::DefUseManager* def_use = context_->get_def_use_mgr();

  SENode* op1 =
      AnalyzeInstruction(def_use->GetDef(multiply->GetSingleWordInOperand(0)));
  SENode* op2 =
      AnalyzeInstruction(def_use->GetDef(multiply->GetSingleWordInOperand(1)));

  return CreateMultiplyNode(op1, op2);
}